

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Tag::Write(Tag *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t uVar2;
  uint64 uVar3;
  IMkvWriter *writer_00;
  long lVar4;
  long *in_RSI;
  uint64 in_RDI;
  int64_t stop;
  SimpleTag *st_1;
  int idx_1;
  int64_t start;
  uint64_t tag_size;
  SimpleTag *st;
  int idx;
  uint64_t payload_size;
  uint64 in_stack_ffffffffffffff98;
  IMkvWriter *in_stack_ffffffffffffffa8;
  int local_44;
  IMkvWriter *in_stack_ffffffffffffffc0;
  SimpleTag *in_stack_ffffffffffffffc8;
  int local_24;
  long local_20;
  SimpleTag *local_8;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0xc); local_24 = local_24 + 1) {
    uVar2 = SimpleTag::Write(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    local_20 = uVar2 + local_20;
  }
  uVar3 = EbmlMasterElementSize(in_RDI,in_stack_ffffffffffffff98);
  local_8 = (SimpleTag *)(uVar3 + local_20);
  if (in_RSI != (long *)0x0) {
    writer_00 = (IMkvWriter *)(**(code **)(*in_RSI + 8))();
    bVar1 = WriteEbmlMasterElement(in_stack_ffffffffffffffa8,in_RDI,in_stack_ffffffffffffff98);
    if (bVar1) {
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0xc); local_44 = local_44 + 1) {
        uVar2 = SimpleTag::Write(local_8,writer_00);
        if (uVar2 == 0) {
          return 0;
        }
      }
      lVar4 = (**(code **)(*in_RSI + 8))();
      if (((long)writer_00 <= lVar4) && ((SimpleTag *)(lVar4 - (long)writer_00) != local_8)) {
        local_8 = (SimpleTag *)0x0;
      }
    }
    else {
      local_8 = (SimpleTag *)0x0;
    }
  }
  return (uint64_t)local_8;
}

Assistant:

uint64_t Tag::Write(IMkvWriter* writer) const {
  uint64_t payload_size = 0;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    const SimpleTag& st = simple_tags_[idx];
    payload_size += st.Write(NULL);
  }

  const uint64_t tag_size =
      EbmlMasterElementSize(libwebm::kMkvTag, payload_size) + payload_size;

  if (writer == NULL)
    return tag_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTag, payload_size))
    return 0;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    const SimpleTag& st = simple_tags_[idx];

    if (!st.Write(writer))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != tag_size)
    return 0;

  return tag_size;
}